

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

string * __thiscall
toml::format<char_const(&)[5],std::__cxx11::string_const&,char_const(&)[16]>
          (string *__return_storage_ptr__,toml *this,stringstream *ss,char (*t) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [16])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  
  args_00 = args;
  std::operator<<((ostream *)(this + 0x10),(char *)ss);
  format<std::__cxx11::string_const&,char_const(&)[16]>
            (__return_storage_ptr__,this,(stringstream *)t,args,(char (*) [16])args_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}